

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SqueezeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_squeeze(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x460) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x460;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    SqueezeLayerParams::SqueezeLayerParams(this_00.squeeze_);
    (this->layer_).squeeze_ = (SqueezeLayerParams *)this_00;
  }
  return (SqueezeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SqueezeLayerParams* NeuralNetworkLayer::mutable_squeeze() {
  if (!has_squeeze()) {
    clear_layer();
    set_has_squeeze();
    layer_.squeeze_ = new ::CoreML::Specification::SqueezeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.squeeze)
  return layer_.squeeze_;
}